

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O0

void * FilterRender::doFlip(void *data,uint width,uint height,bool isLR)

{
  code *pcVar1;
  ulong uVar2;
  void *pvVar3;
  void *pvVar4;
  undefined4 local_70;
  undefined4 local_6c;
  int j_5;
  int i_5;
  int k_3;
  int j_4;
  int i_4;
  int k_2;
  int j_3;
  int i_3;
  int k_1;
  int j_2;
  int i_2;
  int k;
  int j_1;
  int i_1;
  uchar *p;
  int j;
  int i;
  uchar ***map;
  bool isLR_local;
  uint height_local;
  uint width_local;
  void *data_local;
  
  uVar2 = SUB168(ZEXT416(height) * ZEXT816(8),0);
  if (SUB168(ZEXT416(height) * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  for (p._4_4_ = 0; p._4_4_ < height; p._4_4_ = p._4_4_ + 1) {
    uVar2 = SUB168(ZEXT416(width) * ZEXT816(8),0);
    if (SUB168(ZEXT416(width) * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar2);
    *(void **)((long)pvVar3 + (long)(int)p._4_4_ * 8) = pvVar4;
    for (p._0_4_ = 0; (uint)p < width; p._0_4_ = (uint)p + 1) {
      pvVar4 = operator_new__(4);
      *(void **)(*(long *)((long)pvVar3 + (long)(int)p._4_4_ * 8) + (long)(int)(uint)p * 8) = pvVar4
      ;
    }
  }
  _j_1 = data;
  for (k = 0; (uint)k < height; k = k + 1) {
    for (i_2 = 0; (uint)i_2 < width; i_2 = i_2 + 1) {
      for (j_2 = 0; j_2 < 4; j_2 = j_2 + 1) {
        *(undefined1 *)
         (*(long *)(*(long *)((long)pvVar3 + (long)k * 8) + (long)i_2 * 8) + (long)j_2) =
             *(undefined1 *)((long)_j_1 + (long)j_2);
      }
      _j_1 = (void *)((long)_j_1 + 4);
    }
  }
  if (isLR) {
    for (k_1 = 0; (uint)k_1 < height; k_1 = k_1 + 1) {
      for (i_3 = 0; (uint)i_3 < width >> 1; i_3 = i_3 + 1) {
        for (j_3 = 0; j_3 < 4; j_3 = j_3 + 1) {
          swap((uchar *)(*(long *)(*(long *)((long)pvVar3 + (long)k_1 * 8) + (long)i_3 * 8) +
                        (long)j_3),
               (uchar *)(*(long *)(*(long *)((long)pvVar3 + (long)k_1 * 8) +
                                  (ulong)(width - i_3) * 8) + (long)j_3));
        }
      }
    }
  }
  else {
    for (k_2 = 0; (uint)k_2 < height >> 1; k_2 = k_2 + 1) {
      for (i_4 = 0; (uint)i_4 < width; i_4 = i_4 + 1) {
        for (j_4 = 0; j_4 < 4; j_4 = j_4 + 1) {
          swap((uchar *)(*(long *)(*(long *)((long)pvVar3 + (long)k_2 * 8) + (long)i_4 * 8) +
                        (long)j_4),
               (uchar *)(*(long *)(*(long *)((long)pvVar3 + (ulong)(height - k_2) * 8) +
                                  (long)i_4 * 8) + (long)j_4));
        }
      }
    }
  }
  _j_1 = data;
  for (k_3 = 0; (uint)k_3 < height; k_3 = k_3 + 1) {
    for (i_5 = 0; (uint)i_5 < width; i_5 = i_5 + 1) {
      for (j_5 = 0; j_5 < 4; j_5 = j_5 + 1) {
        *(undefined1 *)((long)_j_1 + (long)j_5) =
             *(undefined1 *)
              (*(long *)(*(long *)((long)pvVar3 + (long)k_3 * 8) + (long)i_5 * 8) + (long)j_5);
      }
      _j_1 = (void *)((long)_j_1 + 4);
    }
  }
  for (local_6c = 0; local_6c < height; local_6c = local_6c + 1) {
    for (local_70 = 0; local_70 < width; local_70 = local_70 + 1) {
      pvVar4 = *(void **)(*(long *)((long)pvVar3 + (long)(int)local_6c * 8) +
                         (long)(int)local_70 * 8);
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
    }
    pvVar4 = *(void **)((long)pvVar3 + (long)(int)local_6c * 8);
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void* FilterRender::doFlip(void *data, uint width, uint height, bool isLR) {
	unsigned char ***map;

	map = new unsigned char**[height];
	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	if (isLR) {
		for (int i = 0; i < height; i++) {
			for (int j = 0; j < width / 2; j++) {
				for (int k = 0; k < 4; k++) {
					swap(map[i][j][k], map[i][width - j][k]);
				}
			}
		}
	} else {
		for (int i = 0; i < height / 2; i++) {
			for (int j = 0; j < width; j++) {
				for (int k = 0; k < 4; k++) {
					swap(map[i][j][k], map[height - i][j][k]);
				}
			}
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}